

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *this;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *this_00;
  Type_Info *pTVar4;
  Type_Info *pTVar5;
  const_reference this_01;
  const_reference ti;
  Type_Info *rt;
  Type_Info *lt;
  size_t i;
  Type_Info boxed_pod_type;
  Type_Info boxed_type;
  size_type rhssize;
  size_type lhssize;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *rhsparamtypes;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *lhsparamtypes;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_rhs;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_lhs;
  Proxy_Function *rhs_local;
  Proxy_Function *lhs_local;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
             &dynamic_rhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &dynamic_rhs.
                      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar1)
     ) {
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&dynamic_rhs.
                     super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
    dispatch::Dynamic_Proxy_Function::get_guard((Dynamic_Proxy_Function *)local_50);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_50);
    if (bVar1) {
      std::
      __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_40);
      dispatch::Dynamic_Proxy_Function::get_guard((Dynamic_Proxy_Function *)local_60);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      lhs_local._7_1_ = (bool)(bVar1 - 1U & 1);
      std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
                ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_60);
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &dynamic_rhs.
                        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if ((!bVar1) ||
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar1)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &dynamic_rhs.
                          super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      if ((bVar1) ||
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), !bVar1)) {
        peVar3 = std::
                 __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)lhs);
        this = dispatch::Proxy_Function_Base::get_param_types(peVar3);
        peVar3 = std::
                 __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)rhs);
        this_00 = dispatch::Proxy_Function_Base::get_param_types(peVar3);
        pTVar4 = (Type_Info *)
                 std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                           (this);
        pTVar5 = (Type_Info *)
                 std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                           (this_00);
        user_type<chaiscript::Boxed_Value>();
        user_type<chaiscript::Boxed_Number>();
        for (lt = (Type_Info *)0x1; lt < pTVar4 && lt < pTVar5;
            lt = (Type_Info *)((long)&lt->m_type_info + 1)) {
          this_01 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                    operator[](this,(size_type)lt);
          ti = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
               operator[](this_00,(size_type)lt);
          bVar1 = Type_Info::bare_equal(this_01,ti);
          if (!bVar1) {
LAB_0057f726:
            bVar1 = Type_Info::bare_equal(this_01,ti);
            if (((!bVar1) || (bVar1 = Type_Info::is_const(this_01), !bVar1)) ||
               (bVar1 = Type_Info::is_const(ti), bVar1)) {
              bVar1 = Type_Info::bare_equal(this_01,ti);
              if ((!bVar1) || (bVar1 = Type_Info::is_const(this_01), bVar1)) {
                bVar1 = Type_Info::bare_equal(this_01,(Type_Info *)&boxed_pod_type.m_flags);
                if (bVar1) {
                  lhs_local._7_1_ = false;
                }
                else {
                  bVar1 = Type_Info::bare_equal(ti,(Type_Info *)&boxed_pod_type.m_flags);
                  if (bVar1) {
                    lhs_local._7_1_ = true;
                  }
                  else {
                    bVar1 = Type_Info::bare_equal(this_01,(Type_Info *)&i);
                    if (bVar1) {
                      lhs_local._7_1_ = false;
                    }
                    else {
                      bVar1 = Type_Info::bare_equal(ti,(Type_Info *)&i);
                      if (bVar1) {
                        lhs_local._7_1_ = true;
                      }
                      else {
                        lhs_local._7_1_ = Type_Info::operator<(this_01,ti);
                      }
                    }
                  }
                }
              }
              else {
                lhs_local._7_1_ = true;
              }
            }
            else {
              lhs_local._7_1_ = false;
            }
            goto LAB_0057f88b;
          }
          bVar1 = Type_Info::is_const(this_01);
          bVar2 = Type_Info::is_const(ti);
          if (bVar1 != bVar2) goto LAB_0057f726;
        }
        lhs_local._7_1_ = false;
      }
      else {
        lhs_local._7_1_ = true;
      }
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
LAB_0057f88b:
  std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)local_40);
  std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)
             &dynamic_rhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return lhs_local._7_1_;
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs) noexcept {
        auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
        auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

        if (dynamic_lhs && dynamic_rhs) {
          if (dynamic_lhs->get_guard()) {
            return dynamic_rhs->get_guard() ? false : true;
          } else {
            return false;
          }
        }

        if (dynamic_lhs && !dynamic_rhs) {
          return false;
        }

        if (!dynamic_lhs && dynamic_rhs) {
          return true;
        }

        const auto &lhsparamtypes = lhs->get_param_types();
        const auto &rhsparamtypes = rhs->get_param_types();

        const auto lhssize = lhsparamtypes.size();
        const auto rhssize = rhsparamtypes.size();

        const auto boxed_type = user_type<Boxed_Value>();
        const auto boxed_pod_type = user_type<Boxed_Number>();

        for (size_t i = 1; i < lhssize && i < rhssize; ++i) {
          const Type_Info &lt = lhsparamtypes[i];
          const Type_Info &rt = rhsparamtypes[i];

          if (lt.bare_equal(rt) && lt.is_const() == rt.is_const()) {
            continue; // The first two types are essentially the same, next iteration
          }

          // const is after non-const for the same type
          if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const()) {
            return false;
          }

          if (lt.bare_equal(rt) && !lt.is_const()) {
            return true;
          }

          // boxed_values are sorted last
          if (lt.bare_equal(boxed_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_type)) {
            return true;
          }

          if (lt.bare_equal(boxed_pod_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_pod_type)) {
            return true;
          }

          // otherwise, we want to sort by typeid
          return lt < rt;
        }

        return false;
      }